

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int jmp_list_merge(Parser *psr,int left,int right)

{
  int iVar1;
  int local_24;
  int last;
  int right_local;
  int left_local;
  Parser *psr_local;
  
  psr_local._4_4_ = left;
  if ((right != -1) && (local_24 = right, psr_local._4_4_ = right, left != -1)) {
    while (iVar1 = jmp_follow(psr,local_24), iVar1 != -1) {
      local_24 = jmp_follow(psr,local_24);
    }
    jmp_set_target(psr,local_24,left);
  }
  return psr_local._4_4_;
}

Assistant:

static int jmp_list_merge(Parser *psr, int left, int right) {
	// If either jump list is empty, the result is trivial
	if (right == -1) {
		return left;
	} else if (left == -1) {
		return right;
	}

	// Find the last element in `right`
	int last = right;
	while (jmp_follow(psr, last) != -1) {
		last = jmp_follow(psr, last);
	}

	// Point the last element in `right` to `left`
	jmp_set_target(psr, last, left);

	// The head of the merged list must be `right`
	return right;
}